

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_node *
lys_node_dup(lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow)

{
  int iVar1;
  lys_node *plVar2;
  lys_node *plVar3;
  LYS_NODE LVar4;
  lys_node *plVar5;
  lys_node *node_00;
  
  if (shallow != 0) {
LAB_00156f78:
    plVar2 = lys_node_dup_recursion(module,parent,node,unres,shallow,0);
    return plVar2;
  }
  iVar1 = 1;
  plVar2 = parent;
  if (parent != (lys_node *)0x0) {
    do {
      LVar4 = plVar2->nodetype;
      if ((LVar4 & (LYS_ACTION|LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
      {
        iVar1 = 2;
        if (LVar4 == LYS_GROUPING) {
          shallow = 0;
          goto LAB_00156f78;
        }
        break;
      }
      if (LVar4 == LYS_EXT) {
        if (plVar2->padding[1] != '\x01') break;
        plVar2 = (lys_node *)plVar2->dsc;
      }
      else {
        plVar2 = plVar2->parent;
        if (plVar2 == (lys_node *)0x0) break;
      }
      if (plVar2->nodetype == LYS_AUGMENT) {
        plVar2 = plVar2->prev;
      }
    } while (plVar2 != (lys_node *)0x0);
  }
  plVar3 = lys_node_dup_recursion(module,parent,node,unres,0,iVar1);
  plVar2 = plVar3;
  if (plVar3 != (lys_node *)0x0) {
    while ((node_00 = plVar2, iVar1 = lys_has_xpath(node_00), iVar1 == 0 ||
           (iVar1 = unres_schema_add_node(module,unres,node_00,UNRES_XPATH,(lys_node *)0x0),
           iVar1 != -1))) {
      if (((node_00->nodetype & 0x882c) != LYS_UNKNOWN) ||
         (plVar2 = node_00->child, node_00->child == (lys_node *)0x0)) {
        if (node_00 == plVar3) {
          return plVar3;
        }
        plVar2 = node_00->next;
        if (node_00->next == (lys_node *)0x0) {
          do {
            if (node_00->nodetype == LYS_EXT) {
              if (node_00->padding[1] != '\x01') goto LAB_001570b7;
              node_00 = (lys_node *)node_00->dsc;
LAB_00157089:
              LVar4 = node_00->nodetype;
              if (LVar4 == LYS_AUGMENT) {
                node_00 = node_00->prev;
                if (node_00 == (lys_node *)0x0) goto LAB_001570b7;
                LVar4 = node_00->nodetype;
              }
              if (LVar4 != LYS_EXT) {
                plVar2 = node_00->parent;
                if (plVar2 != (lys_node *)0x0) goto LAB_0015710d;
                goto LAB_001570ba;
              }
              if (node_00->padding[1] != '\x01') goto LAB_001570ba;
              plVar2 = (lys_node *)node_00->dsc;
LAB_0015710d:
              if (plVar2->nodetype == LYS_AUGMENT) {
                plVar2 = plVar2->prev;
              }
            }
            else {
              node_00 = node_00->parent;
              if (node_00 != (lys_node *)0x0) goto LAB_00157089;
LAB_001570b7:
              node_00 = (lys_node *)0x0;
LAB_001570ba:
              plVar2 = (lys_node *)0x0;
            }
            if (plVar3->nodetype == LYS_EXT) {
              if (plVar3->padding[1] != '\x01') goto LAB_001570eb;
              plVar5 = (lys_node *)plVar3->dsc;
LAB_001570dc:
              if (plVar5->nodetype == LYS_AUGMENT) {
                plVar5 = plVar5->prev;
              }
            }
            else {
              plVar5 = plVar3->parent;
              if (plVar5 != (lys_node *)0x0) goto LAB_001570dc;
LAB_001570eb:
              plVar5 = (lys_node *)0x0;
            }
            if (plVar2 == plVar5) {
              return plVar3;
            }
            plVar2 = node_00->next;
          } while (node_00->next == (lys_node *)0x0);
        }
      }
    }
  }
  return (lys_node *)0x0;
}

Assistant:

struct lys_node *
lys_node_dup(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
             struct unres_schema *unres, int shallow)
{
    struct lys_node *p = NULL;
    int finalize = 0;
    struct lys_node *result, *iter, *next;

    if (!shallow) {
        /* get know where in schema tree we are to know what should be done during instantiation of the grouping */
        for (p = parent;
             p && !(p->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC | LYS_ACTION | LYS_GROUPING));
             p = lys_parent(p));
        finalize = p ? ((p->nodetype == LYS_GROUPING) ? 0 : 2) : 1;
    }

    result = lys_node_dup_recursion(module, parent, node, unres, shallow, finalize);
    if (finalize) {
        /* check xpath expressions in the instantiated tree */
        for (iter = next = result; iter; iter = next) {
            if (lys_has_xpath(iter) && unres_schema_add_node(module, unres, iter, UNRES_XPATH, NULL) == -1) {
                /* invalid xpath */
                return NULL;
            }

            /* select next item */
            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                /* child exception for leafs, leaflists and anyxml without children, ignore groupings */
                next = NULL;
            } else {
                next = iter->child;
            }
            if (!next) {
                /* no children, try siblings */
                if (iter == result) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                iter = lys_parent(iter);
                if (lys_parent(iter) == lys_parent(result)) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
        }
    }

    return result;
}